

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O1

string * __thiscall
MinVR::VRError::_errorMessage_abi_cxx11_(string *__return_storage_ptr__,VRError *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_40,"Error: ",&this->_whatMsg);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((this->_adviceMsg)._M_string_length != 0) {
    std::operator+(&local_40,"\n",&this->_adviceMsg);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _errorMessage() const {

    std::string out;

    out = "Error: " + _whatMsg
#ifdef MinVR_DEBUG
      // There is no need to burden the ultimate user with
      // implementation details, so this is inside a DEBUG condition.
      + "\n(MinVR Error reported at " + _whereFile + ":" + _whereLine
      + ", while executing " + _whereFunc + ".)"
#endif
      ;

    if (!_adviceMsg.empty()) {
      out += "\n" + _adviceMsg;
    }

    return out;
  }